

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall pbrt::MLTSampler::Reject(MLTSampler *this)

{
  size_t sVar1;
  PrimarySample *pPVar2;
  long lVar3;
  long lVar4;
  
  sVar1 = (this->X).nStored;
  if (sVar1 != 0) {
    pPVar2 = (this->X).ptr;
    lVar3 = this->currentIteration;
    lVar4 = 0;
    do {
      if (*(long *)((long)&pPVar2->lastModificationIteration + lVar4) == lVar3) {
        *(undefined4 *)((long)&pPVar2->value + lVar4) =
             *(undefined4 *)((long)&pPVar2->valueBackup + lVar4);
        *(undefined8 *)((long)&pPVar2->lastModificationIteration + lVar4) =
             *(undefined8 *)((long)&pPVar2->modifyBackup + lVar4);
      }
      lVar4 = lVar4 + 0x20;
    } while (sVar1 << 5 != lVar4);
  }
  this->currentIteration = this->currentIteration + -1;
  return;
}

Assistant:

PBRT_CPU_GPU
    iterator end() { return ptr + nStored; }